

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_open(lua_State *L)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint flags;
  int iVar6;
  char *pcVar7;
  lua_Integer lVar8;
  uv_fs_t *req;
  luv_req_t *plVar9;
  uv_loop_t *loop;
  char *pcVar10;
  char *pcVar11;
  code *cb;
  
  pcVar7 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar5 = lua_isnumber(L,2);
  if (iVar5 != 0) {
    lVar8 = lua_tointegerx(L,2,(int *)0x0);
    flags = (uint)lVar8;
    goto LAB_001467ed;
  }
  iVar5 = lua_isstring(L,2);
  if (iVar5 == 0) {
    flags = luaL_argerror(L,2,"Expected string or integer for file open mode");
    goto LAB_001467ed;
  }
  pcVar10 = lua_tolstring(L,2,(size_t *)0x0);
  cVar1 = *pcVar10;
  if (cVar1 == 's') {
    if (pcVar10[1] == 'r') {
LAB_00146654:
      if (pcVar10[2] == '\0') {
        flags = 0x101000;
        goto LAB_001467ed;
      }
    }
  }
  else if (cVar1 == 'r') {
    bVar2 = pcVar10[1];
    flags = (uint)bVar2;
    if (bVar2 == 0) goto LAB_001467ed;
    if (bVar2 == 0x2b) {
      flags = 2;
      if (pcVar10[2] == '\0') goto LAB_001467ed;
    }
    else if (bVar2 == 0x73) goto LAB_00146654;
  }
  iVar5 = strcmp(pcVar10,"rs+");
  if (iVar5 == 0) {
    flags = 0x101002;
    goto LAB_001467ed;
  }
  iVar5 = strcmp(pcVar10,"sr+");
  flags = 0x101002;
  if (iVar5 == 0) goto LAB_001467ed;
  if (cVar1 == 'x') {
    bVar4 = true;
    if ((pcVar10[1] == 'w') && (pcVar10[2] == '\0')) {
LAB_001466e7:
      flags = 0x2c1;
      goto LAB_001467ed;
    }
  }
  else {
    if (cVar1 == 'w') {
      cVar3 = pcVar10[1];
      if (cVar3 == '\0') {
        flags = 0x241;
        goto LAB_001467ed;
      }
      if (cVar3 == '+') {
        if (pcVar10[2] == '\0') {
          flags = 0x242;
          goto LAB_001467ed;
        }
      }
      else if ((cVar3 == 'x') && (pcVar10[2] == '\0')) goto LAB_001466e7;
    }
    bVar4 = false;
  }
  iVar5 = strcmp(pcVar10,"wx+");
  if (iVar5 == 0) {
    flags = 0x2c2;
    goto LAB_001467ed;
  }
  iVar5 = strcmp(pcVar10,"xw+");
  flags = 0x2c2;
  if (iVar5 == 0) goto LAB_001467ed;
  if (cVar1 == 'a') {
    if (pcVar10[1] == '\0') {
      flags = 0x441;
      goto LAB_001467ed;
    }
    if ((pcVar10[1] != 'x') || (pcVar10[2] != '\0')) goto LAB_00146754;
  }
  else {
LAB_00146754:
    if ((!bVar4) || ((pcVar10[1] != 'a' || (pcVar10[2] != '\0')))) {
      if ((cVar1 == 'a') && ((pcVar10[1] == '+' && (pcVar10[2] == '\0')))) {
        flags = 0x442;
      }
      else {
        iVar5 = strcmp(pcVar10,"ax+");
        if (iVar5 == 0) {
          flags = 0x4c2;
        }
        else {
          iVar5 = strcmp(pcVar10,"xa+");
          flags = 0x4c2;
          if (iVar5 != 0) {
            flags = luaL_error(L,"Unknown file open flag \'%s\'",pcVar10);
          }
        }
      }
      goto LAB_001467ed;
    }
  }
  flags = 0x4c1;
LAB_001467ed:
  lVar8 = luaL_checkinteger(L,3);
  iVar5 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar9 = luv_setup_req(L,iVar5);
  req->data = plVar9;
  iVar5 = plVar9->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar5 != -2) {
    cb = luv_fs_cb;
  }
  iVar6 = uv_fs_open(loop,req,pcVar7,flags,(int)lVar8,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar6)) {
    if (iVar5 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar9->req_ref);
      return 1;
    }
    iVar5 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar5;
    }
  }
  else {
    lua_pushnil(L);
    pcVar7 = req->path;
    pcVar10 = uv_err_name((int)req->result);
    pcVar11 = uv_strerror((int)req->result);
    if (pcVar7 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar10,pcVar11);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar10,pcVar11,req->path);
    }
    iVar5 = 3;
    pcVar7 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar7);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar5;
}

Assistant:

static int luv_fs_open(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  int flags = luv_check_flags(L, 2);
  int mode = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(open, req, path, flags, mode);
}